

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.h
# Opt level: O0

void __thiscall
server::ctfservmode::dopassflagsequence(ctfservmode *this,clientinfo *actor,clientinfo *target)

{
  int iVar1;
  flag *pfVar2;
  flag *pfVar3;
  char *pcVar4;
  char *pcVar5;
  int local_34;
  int i_1;
  flag *f;
  int i;
  clientinfo *target_local;
  clientinfo *actor_local;
  ctfservmode *this_local;
  
  f._4_4_ = 0;
  while( true ) {
    iVar1 = vector<server::ctfservmode::flag>::length(&this->flags);
    if (iVar1 <= f._4_4_) break;
    pfVar2 = vector<server::ctfservmode::flag>::operator[](&this->flags,f._4_4_);
    pfVar3 = vector<server::ctfservmode::flag>::operator[](&this->flags,f._4_4_);
    if (pfVar3->owner == actor->clientnum) {
      returnflag(this,f._4_4_,0);
      dropflag(this,actor,(clientinfo *)0x0);
      local_34 = 0;
      while( true ) {
        iVar1 = vector<server::ctfservmode::flag>::length(&this->flags);
        if (iVar1 <= local_34) break;
        pfVar3 = vector<server::ctfservmode::flag>::operator[](&this->flags,local_34);
        if (pfVar3->dropper == actor->clientnum) {
          pfVar3 = vector<server::ctfservmode::flag>::operator[](&this->flags,local_34);
          pfVar3->dropper = -1;
          pfVar3 = vector<server::ctfservmode::flag>::operator[](&this->flags,local_34);
          pfVar3->dropcount = 0;
        }
        local_34 = local_34 + 1;
      }
      takeflag(this,target,f._4_4_,pfVar2->version);
      (*(this->super_servmode)._vptr_servmode[0xc])();
      pcVar4 = colorname(actor);
      pcVar5 = colorname(target);
      out(3,"\f0%s \f7passed the flag to \f6%s",pcVar4,pcVar5);
      target->hasPassedFlag = true;
    }
    f._4_4_ = f._4_4_ + 1;
  }
  return;
}

Assistant:

void dopassflagsequence(clientinfo *actor, clientinfo *target)
    {
        loopv(flags)
            {
                flag &f = flags[i];
                if(flags[i].owner == actor->clientnum) {
                    returnflag(i);
                    dropflag(actor);
                    loopv(flags) if(flags[i].dropper == actor->clientnum) { flags[i].dropper = -1; flags[i].dropcount = 0; }
                    takeflag(target, i, f.version);
                    update();
                    out(ECHO_SERV, "\f0%s \f7passed the flag to \f6%s", colorname(actor), colorname(target));
                    target->hasPassedFlag = true;
                }
            }
    }